

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a2a.cc
# Opt level: O0

void __thiscall
bsplib::A2A::A2A(A2A *this,MPI_Comm comm,size_t max_msg_size,size_t small_a2a_size_per_proc,
                double alpha,double beta,Method method)

{
  int iVar1;
  unsigned_long *puVar2;
  value_type local_60;
  unsigned_long local_58 [3];
  Method local_3c;
  double dStack_38;
  Method method_local;
  double beta_local;
  double alpha_local;
  size_t small_a2a_size_per_proc_local;
  size_t max_msg_size_local;
  MPI_Comm comm_local;
  A2A *this_local;
  
  this->m_method = method;
  this->m_pid = 0;
  this->m_nprocs = 0;
  this->m_max_msg_size = max_msg_size;
  this->m_small_a2a_size_per_proc = small_a2a_size_per_proc;
  this->m_send_cap = 0;
  this->m_recv_cap = 0;
  local_3c = method;
  dStack_38 = beta;
  beta_local = alpha;
  alpha_local = (double)small_a2a_size_per_proc;
  small_a2a_size_per_proc_local = max_msg_size;
  max_msg_size_local = (size_t)comm;
  comm_local = (MPI_Comm)this;
  LinCost::LinCost(&this->m_lincost,alpha,beta);
  (this->m_send_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_send_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_send_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->m_send_sizes);
  (this->m_send_pos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_send_pos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_send_pos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->m_send_pos);
  *(undefined8 *)&(this->m_send_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl = 0;
  *(undefined8 *)
   &(this->m_send_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8 = 0;
  *(undefined8 *)
   &(this->m_send_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10 = 0;
  std::vector<char,_std::allocator<char>_>::vector(&this->m_send_bufs);
  (this->m_recv_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_recv_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_recv_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->m_recv_sizes);
  (this->m_recv_pos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_recv_pos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_recv_pos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->m_recv_pos);
  *(undefined8 *)&(this->m_recv_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl = 0;
  *(undefined8 *)
   &(this->m_recv_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8 = 0;
  *(undefined8 *)
   &(this->m_recv_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10 = 0;
  std::vector<char,_std::allocator<char>_>::vector(&this->m_recv_bufs);
  *(undefined8 *)&(this->m_small_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl =
       0;
  *(undefined8 *)
   &(this->m_small_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8 = 0;
  *(undefined8 *)
   &(this->m_small_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10 = 0;
  std::vector<char,_std::allocator<char>_>::vector(&this->m_small_send_buf);
  *(undefined8 *)&(this->m_small_recv_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl =
       0;
  *(undefined8 *)
   &(this->m_small_recv_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8 = 0;
  *(undefined8 *)
   &(this->m_small_recv_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10 = 0;
  std::vector<char,_std::allocator<char>_>::vector(&this->m_small_recv_buf);
  this->m_comm = (MPI_Comm)&ompi_mpi_comm_null;
  this->m_recv_win = (MPI_Win)&ompi_mpi_win_null;
  (this->m_reqs).super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_reqs).super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_reqs).super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::vector(&this->m_reqs);
  (this->m_ready).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_ready).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_ready).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&this->m_ready);
  MPI_Comm_dup(max_msg_size_local,&this->m_comm);
  MPI_Comm_rank(this->m_comm,&this->m_pid);
  MPI_Comm_size(this->m_comm,&this->m_nprocs);
  iVar1 = std::numeric_limits<int>::max();
  local_58[0] = (unsigned_long)(iVar1 / this->m_nprocs);
  puVar2 = std::min<unsigned_long>(&this->m_small_a2a_size_per_proc,local_58);
  this->m_small_a2a_size_per_proc = *puVar2;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->m_send_sizes,(long)this->m_nprocs);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->m_send_pos,(long)this->m_nprocs);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->m_recv_sizes,(long)this->m_nprocs);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->m_recv_pos,(long)this->m_nprocs);
  std::vector<char,_std::allocator<char>_>::resize
            (&this->m_small_send_buf,(long)alpha_local * (long)this->m_nprocs);
  std::vector<char,_std::allocator<char>_>::resize
            (&this->m_small_recv_buf,(long)alpha_local * (long)this->m_nprocs);
  if (this->m_method == MSG) {
    local_60 = (value_type)&ompi_request_null;
    std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::resize
              (&this->m_reqs,(long)(this->m_nprocs * 2),&local_60);
    std::vector<int,_std::allocator<int>_>::resize(&this->m_ready,(long)(this->m_nprocs * 2));
  }
  return;
}

Assistant:

A2A::A2A( MPI_Comm comm,
        std::size_t max_msg_size, std::size_t small_a2a_size_per_proc,
        double alpha, double beta,
        Method method )
    : m_method( method )
    , m_pid( )
    , m_nprocs( )
    , m_max_msg_size( max_msg_size )
    , m_small_a2a_size_per_proc( small_a2a_size_per_proc )
    , m_send_cap(0)
    , m_recv_cap(0)
    , m_lincost( alpha, beta )
    , m_send_sizes()
    , m_send_pos()
    , m_send_bufs()
    , m_recv_sizes()
    , m_recv_pos()
    , m_recv_bufs()
    , m_small_send_buf()
    , m_small_recv_buf()
    , m_comm( MPI_COMM_NULL )
    , m_recv_win(MPI_WIN_NULL)
    , m_reqs()
    , m_ready()
{ 
    MPI_Comm_dup( comm, &m_comm );
    MPI_Comm_rank(m_comm, &m_pid );
    MPI_Comm_size(m_comm, &m_nprocs );

    m_small_a2a_size_per_proc = std::min<size_t>( m_small_a2a_size_per_proc,
            std::numeric_limits<int>::max()/m_nprocs );

    m_send_sizes.resize( m_nprocs );
    m_send_pos.resize( m_nprocs );
    m_recv_sizes.resize( m_nprocs );
    m_recv_pos.resize( m_nprocs );
    m_small_send_buf.resize( small_a2a_size_per_proc * m_nprocs );
    m_small_recv_buf.resize( small_a2a_size_per_proc * m_nprocs );

    if (m_method == MSG) {
        m_reqs.resize( 2*m_nprocs, MPI_REQUEST_NULL );
        m_ready.resize( 2*m_nprocs );
    }
}